

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O3

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<CollectLHSSymbols&>
          (ReplicatedAssignmentPatternExpression *this,AlwaysFFVisitor *visitor)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *this_00;
  long lVar3;
  
  Expression::visitExpression<slang::ast::Expression_const,CollectLHSSymbols&>
            (this->count_,this->count_,visitor);
  sVar1 = (this->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->super_AssignmentPatternExpressionBase).elements_._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar3);
      Expression::visitExpression<slang::ast::Expression_const,CollectLHSSymbols&>
                (this_00,this_00,visitor);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }